

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O0

void __thiscall
CFFFileInput::SetupSIDToGlyphMapWithStandard
          (CFFFileInput *this,unsigned_short *inStandardCharSet,
          unsigned_short inStandardCharSetLength,UShortToCharStringMap *ioCharMap,
          CharStrings *inCharStrings)

{
  CharStrings *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_short,_IndexElement_*>_>,_bool> pVar1;
  CharStringsIndex local_78;
  pair<const_unsigned_short,_IndexElement_*> local_70;
  ushort local_5a;
  _Rb_tree_iterator<std::pair<const_unsigned_short,_IndexElement_*>_> _Stack_58;
  unsigned_short i;
  undefined1 local_50;
  int local_44;
  pair<const_unsigned_short,_IndexElement_*> local_40;
  CharStrings *local_30;
  CharStrings *inCharStrings_local;
  UShortToCharStringMap *ioCharMap_local;
  unsigned_short *puStack_18;
  unsigned_short inStandardCharSetLength_local;
  unsigned_short *inStandardCharSet_local;
  CFFFileInput *this_local;
  
  local_44 = 0;
  local_30 = inCharStrings;
  inCharStrings_local = (CharStrings *)ioCharMap;
  ioCharMap_local._6_2_ = inStandardCharSetLength;
  puStack_18 = inStandardCharSet;
  inStandardCharSet_local = (unsigned_short *)this;
  std::pair<const_unsigned_short,_IndexElement_*>::pair<int,_true>
            (&local_40,&local_44,&inCharStrings->mCharStringsIndex);
  pVar1 = std::
          map<unsigned_short,_IndexElement_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
          ::insert(ioCharMap,&local_40);
  _Stack_58 = pVar1.first._M_node;
  local_50 = pVar1.second;
  for (local_5a = 1; this_00 = inCharStrings_local,
      local_5a < local_30->mCharStringsCount && local_5a < ioCharMap_local._6_2_;
      local_5a = local_5a + 1) {
    local_78 = local_30->mCharStringsIndex + (int)(uint)local_5a;
    std::pair<const_unsigned_short,_IndexElement_*>::pair<IndexElement_*,_true>
              (&local_70,puStack_18 + local_5a,&local_78);
    std::
    map<unsigned_short,_IndexElement_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
    ::insert((map<unsigned_short,_IndexElement_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_IndexElement_*>_>_>
              *)this_00,&local_70);
  }
  return;
}

Assistant:

void CFFFileInput::SetupSIDToGlyphMapWithStandard(	const unsigned short* inStandardCharSet,
													unsigned short inStandardCharSetLength,
													UShortToCharStringMap& ioCharMap,
													const CharStrings& inCharStrings)
{
	ioCharMap.insert(UShortToCharStringMap::value_type(0,inCharStrings.mCharStringsIndex));
	unsigned short i;
	for(i = 1; i < inCharStrings.mCharStringsCount && i < inStandardCharSetLength;++i)
	{
		ioCharMap.insert(UShortToCharStringMap::value_type(
				inStandardCharSet[i],inCharStrings.mCharStringsIndex + i));
	}
}